

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

shared_ptr<CommodoreGCRParser::Sector> __thiscall
CommodoreGCRParser::get_next_sector(CommodoreGCRParser *this)

{
  int max_index_count;
  ushort uVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CommodoreGCRParser *in_RSI;
  size_t c;
  long lVar7;
  shared_ptr<CommodoreGCRParser::Sector> sVar8;
  shared_ptr<CommodoreGCRParser::Sector> sector;
  __shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  std::make_shared<CommodoreGCRParser::Sector>();
  iVar2 = in_RSI->index_count_;
  max_index_count = iVar2 + 2;
joined_r0x001575e0:
  do {
    if (max_index_count <= iVar2) {
LAB_001576be:
      (this->super_Controller).super_Source._vptr_Source = (_func_int **)0x0;
      (this->super_Controller).super_Source.observer_ = (Observer *)0x0;
LAB_001576c4:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<CommodoreGCRParser::Sector>)
             sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>;
    }
    uVar4 = proceed_to_next_block(in_RSI,max_index_count);
    if (uVar4 != 8) {
      iVar2 = in_RSI->index_count_;
      goto joined_r0x001575e0;
    }
    uVar4 = get_next_byte(in_RSI);
    uVar5 = get_next_byte(in_RSI);
    (local_48._M_ptr)->sector = (uint8_t)uVar5;
    uVar5 = get_next_byte(in_RSI);
    (local_48._M_ptr)->track = (uint8_t)uVar5;
    uVar5 = get_next_byte(in_RSI);
    uVar6 = get_next_byte(in_RSI);
    if ((uVar4 & 0xff) ==
        ((uVar6 ^ uVar5) & 0xff ^ (uint)((local_48._M_ptr)->track ^ (local_48._M_ptr)->sector))) {
      while (uVar4 = proceed_to_next_block(in_RSI,max_index_count), uVar4 != 7) {
        if (max_index_count <= in_RSI->index_count_) goto LAB_001576be;
      }
      uVar4 = 0;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        uVar5 = get_next_byte(in_RSI);
        ((local_48._M_ptr)->data)._M_elems[lVar7] = (uchar)uVar5;
        uVar4 = (uint)(byte)((byte)uVar4 ^ ((local_48._M_ptr)->data)._M_elems[lVar7]);
      }
      uVar5 = get_next_byte(in_RSI);
      if (uVar5 == uVar4) {
        uVar1._0_1_ = (local_48._M_ptr)->sector;
        uVar1._1_1_ = (local_48._M_ptr)->track;
        std::__shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&in_RSI->sector_cache_[uVar1].
                    super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>,
                   &local_48);
        _Var3._M_pi = local_48._M_refcount._M_pi;
        local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_Controller).super_Source._vptr_Source = (_func_int **)local_48._M_ptr;
        (this->super_Controller).super_Source.observer_ = (Observer *)_Var3._M_pi;
        local_48._M_ptr = (element_type *)0x0;
        goto LAB_001576c4;
      }
    }
    iVar2 = in_RSI->index_count_;
  } while( true );
}

Assistant:

std::shared_ptr<Sector> get_next_sector() {
			auto sector = std::make_shared<Sector>();
			const int max_index_count = index_count_ + 2;

			while(index_count_ < max_index_count) {
				// look for a sector header
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x08) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				// get sector details, skip if this looks malformed
				uint8_t checksum = uint8_t(get_next_byte());
				sector->sector = uint8_t(get_next_byte());
				sector->track = uint8_t(get_next_byte());
				uint8_t disk_id[2];
				disk_id[0] = uint8_t(get_next_byte());
				disk_id[1] = uint8_t(get_next_byte());
				if(checksum != (sector->sector ^ sector->track ^ disk_id[0] ^ disk_id[1])) continue;

				// look for the following data
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x07) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				checksum = 0;
				for(std::size_t c = 0; c < 256; c++) {
					sector->data[c] = uint8_t(get_next_byte());
					checksum ^= sector->data[c];
				}

				if(checksum == get_next_byte()) {
					uint16_t sector_address = uint16_t((sector->track << 8) | sector->sector);
					sector_cache_[sector_address] = sector;
					return sector;
				}
			}

			return nullptr;
		}